

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

void CaDiCaL::fatal_message_start(void)

{
  fflush(_stdout);
  Terminal::code((Terminal *)terr,"1m");
  fputs("cadical: ",_stderr);
  Terminal::color((Terminal *)terr,0x1f,true);
  fputs("fatal error:",_stderr);
  Terminal::code((Terminal *)terr,"0m");
  fputc(0x20,_stderr);
  return;
}

Assistant:

void fatal_message_start () {
  fflush (stdout);
  terr.bold ();
  fputs ("cadical: ", stderr);
  terr.red (1);
  fputs ("fatal error:", stderr);
  terr.normal ();
  fputc (' ', stderr);
}